

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

typed_expression_t * __thiscall tchecker::ta::system_t::invariant(system_t *this,loc_id_t id)

{
  bool bVar1;
  const_reference this_00;
  element_type *peVar2;
  loc_id_t id_local;
  system_t *this_local;
  
  bVar1 = tchecker::system::locs_t::is_location
                    (&(this->super_system_t).super_system_t.super_locs_t,id);
  if (!bVar1) {
    __assert_fail("is_location(id)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/ta/system.cc"
                  ,0x69,
                  "const tchecker::typed_expression_t &tchecker::ta::system_t::invariant(tchecker::loc_id_t) const"
                 );
  }
  this_00 = std::
            vector<tchecker::ta::system_t::compiled_expression_t,_std::allocator<tchecker::ta::system_t::compiled_expression_t>_>
            ::operator[](&this->_invariants,(ulong)id);
  peVar2 = std::
           __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this_00);
  return peVar2;
}

Assistant:

tchecker::typed_expression_t const & system_t::invariant(tchecker::loc_id_t id) const
{
  assert(is_location(id));
  return *_invariants[id]._typed_expr;
}